

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.h
# Opt level: O2

int GetLatestDataArduinoPressureSensor
              (ARDUINOPRESSURESENSOR *pArduinoPressureSensor,
              ARDUINOPRESSURESENSORDATA *pArduinoPressureSensorData)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ARDUINOPRESSURESENSORDATA *pAVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  size_t __n;
  int Bytes;
  ARDUINOPRESSURESENSORDATA *local_388;
  CHRONO chrono;
  char savebuf [256];
  char recvbuf [512];
  
  Bytes = 0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x200);
  memset(savebuf,0,0x100);
  iVar5 = ReadRS232Port(&pArduinoPressureSensor->RS232Port,(uint8 *)recvbuf,0xff,&Bytes);
  if (iVar5 != 0) {
LAB_00183103:
    pcVar8 = "Error reading data from an ArduinoPressureSensor. ";
LAB_0018310a:
    puts(pcVar8);
    return 1;
  }
  if ((pArduinoPressureSensor->bSaveRawData != 0) &&
     ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
    fwrite(recvbuf,(long)Bytes,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
    fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
  }
  iVar5 = Bytes;
  local_388 = pArduinoPressureSensorData;
  if (0xfe < Bytes) {
    while (iVar5 = Bytes, Bytes == 0xff) {
      dVar1 = GetTimeElapsedChronoQuick(&chrono);
      if (4.0 < dVar1) goto LAB_00183327;
      memcpy(savebuf,recvbuf,(long)Bytes);
      iVar5 = ReadRS232Port(&pArduinoPressureSensor->RS232Port,(uint8 *)recvbuf,0xff,&Bytes);
      if (iVar5 != 0) goto LAB_00183103;
      if ((pArduinoPressureSensor->bSaveRawData != 0) &&
         ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf,(long)Bytes,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
        fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
      }
    }
    __n = (size_t)Bytes;
    memmove(recvbuf + (0xff - __n),recvbuf,__n);
    memcpy(recvbuf,savebuf + __n,(long)(0xff - iVar5));
    iVar5 = 0xff;
  }
  pcVar8 = FindLatestArduinoPressureSensorSentence("Pressure: ",recvbuf);
  pcVar7 = FindLatestArduinoPressureSensorSentence("Temperature: ",recvbuf);
  do {
    pAVar4 = local_388;
    if ((pcVar8 != (char *)0x0) && (pcVar7 != (char *)0x0)) {
      iVar5 = __isoc99_sscanf(pcVar8,"Pressure: %lf mbar",local_388);
      if (iVar5 == 1) {
        pAVar4->Pressure = pAVar4->pressure / 1000.0;
        iVar5 = __isoc99_sscanf(pcVar8,"Temperature: %lf deg C",&pAVar4->temperature);
        if (iVar5 == 1) {
          (pArduinoPressureSensor->LastArduinoPressureSensorData).Pressure = pAVar4->Pressure;
          dVar1 = pAVar4->pressure;
          dVar2 = pAVar4->temperature;
          dVar3 = pAVar4->altitude;
          (pArduinoPressureSensor->LastArduinoPressureSensorData).depth = pAVar4->depth;
          (pArduinoPressureSensor->LastArduinoPressureSensorData).altitude = dVar3;
          (pArduinoPressureSensor->LastArduinoPressureSensorData).pressure = dVar1;
          (pArduinoPressureSensor->LastArduinoPressureSensorData).temperature = dVar2;
          return 0;
        }
      }
      pcVar8 = "Error reading data from an ArduinoPressureSensor : Invalid data. ";
      goto LAB_0018310a;
    }
    dVar1 = GetTimeElapsedChronoQuick(&chrono);
    if (4.0 < dVar1) {
LAB_00183327:
      puts("Error reading data from an ArduinoPressureSensor : Message timeout. ");
      return 2;
    }
    if (0x1fe < iVar5) {
      puts("Error reading data from an ArduinoPressureSensor : Invalid data. ");
      return 4;
    }
    iVar6 = ReadRS232Port(&pArduinoPressureSensor->RS232Port,(uint8 *)(recvbuf + iVar5),
                          0x1ff - iVar5,&Bytes);
    if (iVar6 != 0) goto LAB_00183103;
    if ((pArduinoPressureSensor->bSaveRawData != 0) &&
       ((FILE *)pArduinoPressureSensor->pfSaveFile != (FILE *)0x0)) {
      fwrite(recvbuf + iVar5,(long)Bytes,1,(FILE *)pArduinoPressureSensor->pfSaveFile);
      fflush((FILE *)pArduinoPressureSensor->pfSaveFile);
    }
    iVar5 = iVar5 + Bytes;
    pcVar8 = FindLatestArduinoPressureSensorSentence("Pressure: ",recvbuf);
    pcVar7 = FindLatestArduinoPressureSensorSentence("Temperature: ",recvbuf);
  } while( true );
}

Assistant:

inline int GetLatestDataArduinoPressureSensor(ARDUINOPRESSURESENSOR* pArduinoPressureSensor, ARDUINOPRESSURESENSORDATA* pArduinoPressureSensorData)
{
	char recvbuf[2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR];
	char savebuf[MAX_NB_BYTES_ARDUINOPRESSURESENSOR];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_P = NULL;
	char* ptr_T = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from an ArduinoPressureSensor. \n");
		return EXIT_FAILURE;
	}
	if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
		fflush(pArduinoPressureSensor->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_ARDUINOPRESSURESENSOR)
			{
				printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from an ArduinoPressureSensor. \n");
				return EXIT_FAILURE;
			}
			if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
				fflush(pArduinoPressureSensor->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr_P = FindLatestArduinoPressureSensorSentence("Pressure: ", recvbuf);
	ptr_T = FindLatestArduinoPressureSensorSentence("Temperature: ", recvbuf);

	while ((!ptr_P)||(!ptr_T))
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_ARDUINOPRESSURESENSOR)
		{
			printf("Error reading data from an ArduinoPressureSensor : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pArduinoPressureSensor->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_ARDUINOPRESSURESENSOR-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from an ArduinoPressureSensor. \n");
			return EXIT_FAILURE;
		}
		if ((pArduinoPressureSensor->bSaveRawData)&&(pArduinoPressureSensor->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pArduinoPressureSensor->pfSaveFile);
			fflush(pArduinoPressureSensor->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr_P = FindLatestArduinoPressureSensorSentence("Pressure: ", recvbuf);
		ptr_T = FindLatestArduinoPressureSensorSentence("Temperature: ", recvbuf);
	}

	// Analyze data.

	//memset(pArduinoPressureSensorData, 0, sizeof(ARDUINOPRESSURESENSORDATA));

	if (ptr_P)
	{
		if (sscanf(ptr_P, "Pressure: %lf mbar", &pArduinoPressureSensorData->pressure) != 1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_FAILURE;
		}
		// Conversions...
		pArduinoPressureSensorData->Pressure = pArduinoPressureSensorData->pressure/1000.0;
	}
	if (ptr_T)
	{
		if (sscanf(ptr_P, "Temperature: %lf deg C", &pArduinoPressureSensorData->temperature) != 1)
		{
			printf("Error reading data from an ArduinoPressureSensor : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}

	pArduinoPressureSensor->LastArduinoPressureSensorData = *pArduinoPressureSensorData;

	return EXIT_SUCCESS;
}